

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

void __thiscall BasePort::BroadcastReadInfo::PrepareForRead(BroadcastReadInfo *this)

{
  long lVar1;
  
  this->updateStartTime = 1.0;
  this->updateFinishTime = 0.0;
  this->updateOverflow = false;
  this->readOverflow = false;
  for (lVar1 = 0; lVar1 != 0x200; lVar1 = lVar1 + 0x20) {
    (&this->boardInfo[0].updated)[lVar1] = false;
  }
  return;
}

Assistant:

void BasePort::BroadcastReadInfo::PrepareForRead()
{
    // Initialize update Start/Finish times (i.e., start/end of data update on FPGA Hub)
    // Units are seconds.
    updateStartTime = 1.0;
    updateFinishTime = 0.0;
    updateOverflow = false;
    readOverflow = false;
    for (unsigned int bnum = 0; bnum < BoardIO::MAX_BOARDS; bnum++)
        boardInfo[bnum].updated = false;
}